

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void pop_reg(PDISASM pMyDisasm,int index)

{
  int iVar1;
  Int32 IVar2;
  
  (pMyDisasm->Instruction).Category = 0x10001;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"pop",4);
  iVar1 = (pMyDisasm->Reserved_).OperandSize;
  if ((pMyDisasm->Reserved_).Architecture == 0x40) {
    if (iVar1 == 0x10) {
LAB_0013faeb:
      strcpy((pMyDisasm->Operand1).OpMnemonic,Registers16Bits[index]);
      (pMyDisasm->Operand1).OpType = 0x20000;
      (pMyDisasm->Operand1).Registers.type = 1;
      (pMyDisasm->Operand1).Registers.gpr = REGS[index];
      IVar2 = 0x10;
    }
    else {
      if ((iVar1 != 0x40) && (iVar1 != 0x20)) goto LAB_0013fb34;
      iVar1 = index + 8;
      if ((pMyDisasm->Reserved_).REX.B_ == '\0') {
        iVar1 = index;
      }
      strcpy((pMyDisasm->Operand1).OpMnemonic,Registers64Bits[iVar1]);
      (pMyDisasm->Operand1).OpType = 0x20000;
      (pMyDisasm->Operand1).Registers.type = 1;
      (pMyDisasm->Operand1).Registers.gpr = REGS[iVar1];
      IVar2 = 0x40;
    }
  }
  else {
    if (iVar1 != 0x20) goto LAB_0013faeb;
    strcpy((pMyDisasm->Operand1).OpMnemonic,Registers32Bits[index]);
    (pMyDisasm->Operand1).OpType = 0x20000;
    (pMyDisasm->Operand1).Registers.type = 1;
    (pMyDisasm->Operand1).Registers.gpr = REGS[index];
    IVar2 = 0x20;
  }
  (pMyDisasm->Operand1).OpSize = IVar2;
  (pMyDisasm->Operand2).OpSize = IVar2;
LAB_0013fb34:
  (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
  (pMyDisasm->Operand2).OpType = 0x30000;
  (pMyDisasm->Operand2).Memory.BaseRegister = 0x10;
  (pMyDisasm->Instruction).ImplicitModifiedRegs.type = 1;
  (pMyDisasm->Instruction).ImplicitModifiedRegs.gpr = 0x10;
  return;
}

Assistant:

void __bea_callspec__ pop_reg(PDISASM pMyDisasm, int index)
{
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+DATA_TRANSFER;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pop");
    #endif
    if (GV.Architecture == 64) {
      switch(GV.OperandSize) {
        case 64:

        case 32:
          if (GV.REX.B_ == 0) {
              #ifndef BEA_LIGHT_DISASSEMBLY
                 (void) strcpy((char*) &pMyDisasm->Operand1.OpMnemonic, Registers64Bits[index]);
              #endif
              pMyDisasm->Operand1.OpType = REGISTER_TYPE;
              pMyDisasm->Operand1.Registers.type = GENERAL_REG;
              pMyDisasm->Operand1.Registers.gpr = REGS[index];
          }
          else {
              #ifndef BEA_LIGHT_DISASSEMBLY
                 (void) strcpy((char*) &pMyDisasm->Operand1.OpMnemonic, Registers64Bits[index+8]);
              #endif
              pMyDisasm->Operand1.OpType = REGISTER_TYPE;
              pMyDisasm->Operand1.Registers.type = GENERAL_REG;
              pMyDisasm->Operand1.Registers.gpr = REGS[index+8];
          }
          pMyDisasm->Operand1.OpSize = 64;
          pMyDisasm->Operand2.OpSize = 64;
          break;

        case 16:
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy((char*) &pMyDisasm->Operand1.OpMnemonic, Registers16Bits[index]);
          #endif
          pMyDisasm->Operand1.OpType = REGISTER_TYPE;
          pMyDisasm->Operand1.Registers.type = GENERAL_REG;
          pMyDisasm->Operand1.Registers.gpr = REGS[index];
          pMyDisasm->Operand1.OpSize = 16;
          pMyDisasm->Operand2.OpSize = 16;
      }
    }
    else {
        if (GV.OperandSize == 32) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy((char*) &pMyDisasm->Operand1.OpMnemonic, Registers32Bits[index]);
            #endif
            pMyDisasm->Operand1.OpType = REGISTER_TYPE;
            pMyDisasm->Operand1.Registers.type = GENERAL_REG;
            pMyDisasm->Operand1.Registers.gpr = REGS[index];
            pMyDisasm->Operand1.OpSize = 32;
            pMyDisasm->Operand2.OpSize = 32;
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy((char*) &pMyDisasm->Operand1.OpMnemonic, Registers16Bits[index]);
            #endif
            pMyDisasm->Operand1.OpType = REGISTER_TYPE;
            pMyDisasm->Operand1.Registers.type = GENERAL_REG;
            pMyDisasm->Operand1.Registers.gpr = REGS[index];
            pMyDisasm->Operand1.OpSize = 16;
            pMyDisasm->Operand2.OpSize = 16;
        }
    }
    GV.EIP_++;
    pMyDisasm->Operand2.OpType = MEMORY_TYPE;
    pMyDisasm->Operand2.Memory.BaseRegister = REG4;
    pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
    pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG4;
}